

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O2

void asm_phi_break(ASMState *as,RegSet blocked,RegSet blockedby,RegSet allow)

{
  Reg up;
  uint uVar1;
  uint uVar2;
  
  uVar2 = allow & blocked;
  if (uVar2 != 0) {
    up = ra_pick(as,~blocked & allow);
    uVar1 = ~blockedby & uVar2;
    if ((~blockedby & uVar2) == 0) {
      uVar1 = uVar2;
    }
    uVar1 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar2 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    ra_rename(as,uVar2 ^ 0x18,up);
    return;
  }
  return;
}

Assistant:

static void asm_phi_break(ASMState *as, RegSet blocked, RegSet blockedby,
			  RegSet allow)
{
  RegSet candidates = blocked & allow;
  if (candidates) {  /* If this register file has candidates. */
    /* Note: the set for ra_pick cannot be empty, since each register file
    ** has some registers never allocated to PHIs.
    */
    Reg down, up = ra_pick(as, ~blocked & allow);  /* Get a free register. */
    if (candidates & ~blockedby)  /* Optimize shifts, else it's a cycle. */
      candidates = candidates & ~blockedby;
    down = rset_picktop(candidates);  /* Pick candidate PHI register. */
    ra_rename(as, down, up);  /* And rename it to the free register. */
  }
}